

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::ProcessCapturedSym(ByteCodeGenerator *this,Symbol *sym)

{
  byte bVar1;
  FuncInfo *funcInfo;
  FuncInfo *this_00;
  ParseableFunctionInfo *pPVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  ParseNodeFnc *pPVar7;
  Symbol *pSVar8;
  
  funcInfo = sym->scope->func;
  this_00 = funcInfo->currentChildFunction;
  bVar4 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if ((!bVar4) && ((*(ushort *)&sym->field_0x42 & 0xc008) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc4c,
                       "(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage())"
                       ,
                       "sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage()"
                      );
    if (!bVar4) goto LAB_00823a6a;
    *puVar5 = 0;
  }
  if (sym->scope->scopeType == ScopeType_FuncExpr) {
    if (funcInfo->paramScope != (Scope *)0x0) {
      for (pSVar8 = funcInfo->paramScope->m_symList; pSVar8 != (Symbol *)0x0; pSVar8 = pSVar8->next)
      {
        bVar4 = JsUtil::CharacterBuffer<char16_t>::operator==(&pSVar8->name,&sym->name);
        if (bVar4) goto LAB_00823833;
      }
    }
    if (((funcInfo->field_0xb5 & 0x80) != 0) && (funcInfo->bodyScope != (Scope *)0x0)) {
      for (pSVar8 = funcInfo->bodyScope->m_symList; pSVar8 != (Symbol *)0x0; pSVar8 = pSVar8->next)
      {
        bVar4 = JsUtil::CharacterBuffer<char16_t>::operator==(&pSVar8->name,&sym->name);
        if (bVar4) goto LAB_00823833;
      }
    }
  }
LAB_0082383c:
  bVar4 = FuncInfo::IsGlobalFunction(funcInfo);
  if ((((bVar4) || ((*(uint *)&funcInfo->field_0xb4 & 2) != 0)) ||
      (this_00 == (FuncInfo *)0x0 || (char)((*(uint *)&funcInfo->field_0xb4 & 4) >> 2) != '\0')) ||
     ((sym->scope != funcInfo->bodyScope ||
      (bVar1 = this->m_utf8SourceInfo->field_0xa8,
      (byte)((bVar1 >> 5 | (this->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
            (bVar1 & 0x40) >> 6) != 0)))) {
LAB_00823949:
    sym->field_0x43 = sym->field_0x43 | 4;
  }
  else {
    sourceContextId =
         Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    pPVar2 = funcInfo->byteCodeFunction;
    pFVar6 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_00823a6a;
      *puVar5 = 0;
      pFVar6 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,DelayCapturePhase,sourceContextId,pFVar6->functionId)
    ;
    if (bVar4) goto LAB_00823949;
  }
  bVar4 = Symbol::GetIsCommittedToSlot(sym);
  if (!bVar4) {
    if (this_00 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6b,"(funcChild)","funcChild");
      if (!bVar4) goto LAB_00823a6a;
      *puVar5 = 0;
    }
    pPVar7 = this_00->root;
    if ((pPVar7 == (ParseNodeFnc *)0x0) || ((pPVar7->super_ParseNode).nop != knopFncDecl)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xc6e,"(pnodeChild && pnodeChild->nop == knopFncDecl)",
                         "pnodeChild && pnodeChild->nop == knopFncDecl");
      if (!bVar4) {
LAB_00823a6a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pPVar7 = ParseNode::AsParseNodeFnc(&pPVar7->super_ParseNode);
    if (((pPVar7->fncFlags & kFunctionDeclaration) == kFunctionNone) ||
       ((funcInfo->currentChildScope != sym->scope &&
        (funcInfo->currentChildScope->scopeType != ScopeType_FunctionBody)))) {
      FuncInfo::AddCapturedSym(this_00,sym);
      return;
    }
    sym->field_0x43 = sym->field_0x43 | 4;
  }
  return;
LAB_00823833:
  Scope::SetIsObject(sym->scope);
  goto LAB_0082383c;
}

Assistant:

void ByteCodeGenerator::ProcessCapturedSym(Symbol *sym)
{
    // The symbol's home function will tell us which child function we're currently processing.
    // This is the one that captures the symbol, from the declaring function's perspective.
    // So based on that information, note either that, (a.) the symbol is committed to the heap from its
    // inception, (b.) the symbol must be committed when the capturing function is instantiated.

    FuncInfo *funcHome = sym->GetScope()->GetFunc();
    FuncInfo *funcChild = funcHome->GetCurrentChildFunction();

    Assert(sym->NeedsSlotAlloc(this, funcHome) || sym->GetIsGlobal() || sym->GetIsModuleImport() || sym->GetIsModuleExportStorage());

    if (sym->GetScope()->GetScopeType() == ScopeType_FuncExpr)
    {
        if ((funcHome->GetParamScope() && Scope::HasSymbolName(funcHome->GetParamScope(), sym->GetName())) ||
            (funcHome->IsBodyAndParamScopeMerged() && funcHome->GetBodyScope() && Scope::HasSymbolName(funcHome->GetBodyScope(), sym->GetName())))
        {
            // Make sure the function expression scope gets instantiated, since we can't merge the name symbol into another scope.
            // Make it an object, since that's the only case the code gen can currently handle.
            sym->GetScope()->SetIsObject();
        }
    }

    // If this is not a local property, or not all its references can be tracked, or
    // it's not scoped to the function, or we're in debug mode, disable the delayed capture optimization.
    if (funcHome->IsGlobalFunction() ||
        funcHome->GetCallsEval() ||
        funcHome->GetChildCallsEval() ||
        funcChild == nullptr ||
        sym->GetScope() != funcHome->GetBodyScope() ||
        this->IsInDebugMode() ||
        PHASE_OFF(Js::DelayCapturePhase, funcHome->byteCodeFunction))
    {
        sym->SetIsCommittedToSlot();
    }

    if (sym->GetIsCommittedToSlot())
    {
        return;
    }

    AnalysisAssert(funcChild);
    ParseNode *pnodeChild = funcChild->root;

    Assert(pnodeChild && pnodeChild->nop == knopFncDecl);

    if (pnodeChild->AsParseNodeFnc()->IsDeclaration())
    {
        // The capturing function is a declaration but may still be limited to an inner scope.
        Scope *scopeChild = funcHome->GetCurrentChildScope();
        if (scopeChild == sym->GetScope() || scopeChild->GetScopeType() == ScopeType_FunctionBody)
        {
            // The symbol is captured on entry to the scope in which it's declared.
            // (Check the scope type separately so that we get the special parameter list and
            // named function expression cases as well.)
            sym->SetIsCommittedToSlot();
            return;
        }
    }

    // There is a chance we can limit the region in which the symbol lives on the heap.
    // Note which function captures the symbol.
    funcChild->AddCapturedSym(sym);
}